

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-bson.c
# Opt level: O1

void append_one(bson *bs,lua_State *L,char *key,size_t sz)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  size_t n;
  uint8_t *puVar4;
  int *__src;
  char *pcVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  _Bool isarray;
  size_t __n;
  uint8_t uVar10;
  ulong uVar11;
  size_t len;
  anon_union_8_2_94730066 v;
  size_t len_1;
  ulong local_50;
  uint8_t *local_48;
  int local_40;
  undefined4 uStack_3c;
  uint8_t *local_38;
  
  iVar1 = lua_type(L,-1);
  switch(iVar1) {
  case 1:
    iVar1 = bs->size;
    iVar7 = bs->cap;
    if (iVar7 <= iVar1) {
      do {
        iVar7 = iVar7 * 2;
      } while (iVar7 <= iVar1 + 1);
      bs->cap = iVar7;
      if (bs->ptr == bs->buffer) {
        puVar4 = (uint8_t *)malloc((long)iVar7);
        bs->ptr = puVar4;
        memcpy(puVar4,bs->buffer,(long)iVar1);
      }
      else {
        puVar4 = (uint8_t *)realloc(bs->ptr,(long)iVar7);
        bs->ptr = puVar4;
      }
    }
    iVar1 = bs->size;
    bs->size = iVar1 + 1;
    bs->ptr[iVar1] = '\b';
    write_string(bs,key,sz);
    iVar8 = lua_toboolean(L,-1);
    iVar1 = bs->size;
    iVar7 = bs->cap;
    if (iVar7 <= iVar1) {
      do {
        iVar7 = iVar7 * 2;
      } while (iVar7 <= iVar1 + 1);
      bs->cap = iVar7;
      if (bs->ptr == bs->buffer) {
        puVar4 = (uint8_t *)malloc((long)iVar7);
        bs->ptr = puVar4;
        memcpy(puVar4,bs->buffer,(long)iVar1);
      }
      else {
        puVar4 = (uint8_t *)realloc(bs->ptr,(long)iVar7);
        bs->ptr = puVar4;
      }
    }
    iVar1 = bs->size;
    bs->size = iVar1 + 1;
    bs->ptr[iVar1] = (uint8_t)iVar8;
    break;
  default:
    pcVar2 = lua_typename(L,iVar1);
    luaL_error(L,"Invalid value type : %s",pcVar2);
    return;
  case 3:
    iVar1 = lua_isinteger(L,-1);
    if (iVar1 == 0) {
      local_48 = (uint8_t *)lua_tonumberx(L,-1,(int *)0x0);
      iVar1 = bs->size;
      iVar7 = bs->cap;
      if (iVar7 <= iVar1) {
        do {
          iVar7 = iVar7 * 2;
        } while (iVar7 <= iVar1 + 1);
        bs->cap = iVar7;
        if (bs->ptr == bs->buffer) {
          puVar4 = (uint8_t *)malloc((long)iVar7);
          bs->ptr = puVar4;
          memcpy(puVar4,bs->buffer,(long)iVar1);
        }
        else {
          puVar4 = (uint8_t *)realloc(bs->ptr,(long)iVar7);
          bs->ptr = puVar4;
        }
      }
      iVar1 = bs->size;
      bs->size = iVar1 + 1;
      bs->ptr[iVar1] = '\x01';
      write_string(bs,key,sz);
      iVar1 = bs->size;
      iVar8 = iVar1 + 8;
      iVar7 = bs->cap;
      if (iVar7 < iVar8) {
        do {
          iVar7 = iVar7 * 2;
        } while (iVar7 <= iVar8);
        bs->cap = iVar7;
        if (bs->ptr == bs->buffer) {
          puVar4 = (uint8_t *)malloc((long)iVar7);
          bs->ptr = puVar4;
          memcpy(puVar4,bs->buffer,(long)iVar1);
        }
        else {
          puVar4 = (uint8_t *)realloc(bs->ptr,(long)iVar7);
          bs->ptr = puVar4;
        }
      }
      uVar3 = 0xfffffffffffffff8;
      do {
        uVar3 = uVar3 + 8;
        iVar1 = bs->size;
        bs->size = iVar1 + 1;
        bs->ptr[iVar1] = (uint8_t)((ulong)local_48 >> ((byte)uVar3 & 0x3f));
      } while (uVar3 < 0x38);
    }
    else {
      uVar3 = lua_tointegerx(L,-1,(int *)0x0);
      iVar1 = bs->size;
      iVar7 = bs->cap;
      if ((long)(int)uVar3 == uVar3) {
        if (iVar7 <= iVar1) {
          do {
            iVar7 = iVar7 * 2;
          } while (iVar7 <= iVar1 + 1);
          bs->cap = iVar7;
          if (bs->ptr == bs->buffer) {
            puVar4 = (uint8_t *)malloc((long)iVar7);
            bs->ptr = puVar4;
            memcpy(puVar4,bs->buffer,(long)iVar1);
          }
          else {
            puVar4 = (uint8_t *)realloc(bs->ptr,(long)iVar7);
            bs->ptr = puVar4;
          }
        }
        iVar1 = bs->size;
        bs->size = iVar1 + 1;
        bs->ptr[iVar1] = '\x10';
        write_string(bs,key,sz);
        iVar1 = bs->size;
        iVar8 = iVar1 + 4;
        iVar7 = bs->cap;
        if (iVar7 < iVar8) {
          do {
            iVar7 = iVar7 * 2;
          } while (iVar7 <= iVar8);
          bs->cap = iVar7;
          if (bs->ptr == bs->buffer) {
            puVar4 = (uint8_t *)malloc((long)iVar7);
            bs->ptr = puVar4;
            memcpy(puVar4,bs->buffer,(long)iVar1);
          }
          else {
            puVar4 = (uint8_t *)realloc(bs->ptr,(long)iVar7);
            bs->ptr = puVar4;
          }
        }
        iVar1 = bs->size;
        bs->size = iVar1 + 1;
        bs->ptr[iVar1] = (uint8_t)uVar3;
        iVar1 = bs->size;
        bs->size = iVar1 + 1;
        bs->ptr[iVar1] = (uint8_t)(uVar3 >> 8);
        iVar1 = bs->size;
        bs->size = iVar1 + 1;
        bs->ptr[iVar1] = (uint8_t)(uVar3 >> 0x10);
        iVar1 = bs->size;
        bs->size = iVar1 + 1;
        bs->ptr[iVar1] = (uint8_t)(uVar3 >> 0x18);
      }
      else {
        if (iVar7 <= iVar1) {
          do {
            iVar7 = iVar7 * 2;
          } while (iVar7 <= iVar1 + 1);
          bs->cap = iVar7;
          if (bs->ptr == bs->buffer) {
            puVar4 = (uint8_t *)malloc((long)iVar7);
            bs->ptr = puVar4;
            memcpy(puVar4,bs->buffer,(long)iVar1);
          }
          else {
            puVar4 = (uint8_t *)realloc(bs->ptr,(long)iVar7);
            bs->ptr = puVar4;
          }
        }
        iVar1 = bs->size;
        bs->size = iVar1 + 1;
        bs->ptr[iVar1] = '\x12';
        write_string(bs,key,sz);
        iVar1 = bs->size;
        iVar8 = iVar1 + 8;
        iVar7 = bs->cap;
        if (iVar7 < iVar8) {
          do {
            iVar7 = iVar7 * 2;
          } while (iVar7 <= iVar8);
          bs->cap = iVar7;
          if (bs->ptr == bs->buffer) {
            puVar4 = (uint8_t *)malloc((long)iVar7);
            bs->ptr = puVar4;
            memcpy(puVar4,bs->buffer,(long)iVar1);
          }
          else {
            puVar4 = (uint8_t *)realloc(bs->ptr,(long)iVar7);
            bs->ptr = puVar4;
          }
        }
        uVar9 = 0xfffffffffffffff8;
        do {
          uVar9 = uVar9 + 8;
          iVar1 = bs->size;
          bs->size = iVar1 + 1;
          bs->ptr[iVar1] = (uint8_t)(uVar3 >> ((byte)uVar9 & 0x3f));
        } while (uVar9 < 0x38);
      }
    }
    break;
  case 4:
    pcVar2 = lua_tolstring(L,-1,&local_50);
    if ((local_50 < 2) || (*pcVar2 != '\0')) {
      pcVar2 = lua_tolstring(L,-1,(size_t *)&local_40);
      iVar1 = bs->size;
      iVar7 = bs->cap;
      if (iVar7 <= iVar1) {
        do {
          iVar7 = iVar7 * 2;
        } while (iVar7 <= iVar1 + 1);
        bs->cap = iVar7;
        if (bs->ptr == bs->buffer) {
          puVar4 = (uint8_t *)malloc((long)iVar7);
          bs->ptr = puVar4;
          memcpy(puVar4,bs->buffer,(long)iVar1);
        }
        else {
          puVar4 = (uint8_t *)realloc(bs->ptr,(long)iVar7);
          bs->ptr = puVar4;
        }
      }
      iVar1 = bs->size;
      bs->size = iVar1 + 1;
      bs->ptr[iVar1] = '\x02';
      write_string(bs,key,sz);
      __n = (size_t)bs->size;
      iVar7 = bs->size + 4;
      iVar1 = bs->cap;
      if (iVar1 < iVar7) {
        do {
          iVar1 = iVar1 * 2;
        } while (iVar1 <= iVar7);
        bs->cap = iVar1;
        if (bs->ptr == bs->buffer) {
          puVar4 = (uint8_t *)malloc((long)iVar1);
          bs->ptr = puVar4;
          memcpy(puVar4,bs->buffer,__n);
        }
        else {
          puVar4 = (uint8_t *)realloc(bs->ptr,(long)iVar1);
          bs->ptr = puVar4;
        }
      }
      bs->size = bs->size + 4;
      write_string(bs,pcVar2,CONCAT44(uStack_3c,local_40));
      local_40 = local_40 + 1;
      bs->ptr[__n] = (uint8_t)local_40;
      bs->ptr[__n + 1] = (uint8_t)((uint)local_40 >> 8);
      bs->ptr[__n + 2] = (uint8_t)((uint)local_40 >> 0x10);
      bs->ptr[__n + 3] = (uint8_t)((uint)local_40 >> 0x18);
      return;
    }
    local_48 = (uint8_t *)(ulong)(byte)pcVar2[1];
    iVar1 = bs->size;
    iVar7 = bs->cap;
    if (iVar7 <= iVar1) {
      do {
        iVar7 = iVar7 * 2;
      } while (iVar7 <= iVar1 + 1);
      bs->cap = iVar7;
      if (bs->ptr == bs->buffer) {
        local_38 = bs->buffer;
        puVar4 = (uint8_t *)malloc((long)iVar7);
        bs->ptr = puVar4;
        memcpy(puVar4,local_38,(long)iVar1);
      }
      else {
        puVar4 = (uint8_t *)realloc(bs->ptr,(long)iVar7);
        bs->ptr = puVar4;
      }
    }
    puVar4 = local_48;
    iVar1 = bs->size;
    bs->size = iVar1 + 1;
    bs->ptr[iVar1] = (uint8_t)local_48;
    write_string(bs,key,sz);
    iVar1 = (int)puVar4;
    switch(iVar1) {
    case 5:
      write_binary(bs,pcVar2 + 2,local_50 - 2);
      return;
    case 7:
      if (local_50 != 0xe) {
        luaL_error(L,"Invalid object id %s",pcVar2 + 2);
      }
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
      bson_reserve(bs,(int)local_50 + -2);
      memcpy(bs->ptr + bs->size,pcVar2 + 2,local_50 - 2);
      bs->size = (int)local_50 + bs->size + -2;
      return;
    case 9:
      if (local_50 != 6) {
        luaL_error(L,"Invalid date");
      }
      write_int64(bs,(ulong)*(uint *)(pcVar2 + 2) * 1000);
      return;
    case 10:
      return;
    case 0xb:
      goto switchD_0011b2a2_caseD_b;
    case 0x11:
      if (local_50 != 10) {
        luaL_error(L,"Invalid timestamp");
      }
      write_int32(bs,*(int32_t *)(pcVar2 + 2));
      write_int32(bs,*(int32_t *)(pcVar2 + 6));
      return;
    default:
      if (iVar1 == 0x7f) {
        return;
      }
      if (iVar1 == 0xff) {
        return;
      }
    case 6:
    case 8:
    case 0x10:
      luaL_error(L,"Invalid subtype %d",(ulong)puVar4 & 0xffffffff);
      return;
    }
  case 5:
    n = lua_rawlen(L,-1);
    if (n != 0) {
      lua_pushinteger(L,n);
      iVar1 = lua_next(L,-2);
      if (iVar1 == 0) {
        isarray = true;
        goto LAB_0011ac8c;
      }
      lua_settop(L,-3);
    }
    isarray = false;
LAB_0011ac8c:
    iVar1 = bs->size;
    iVar7 = bs->cap;
    if (isarray == false) {
      uVar10 = '\x03';
      if (iVar7 <= iVar1) {
        do {
          iVar7 = iVar7 * 2;
        } while (iVar7 <= iVar1 + 1);
        bs->cap = iVar7;
        if (bs->ptr == bs->buffer) {
          local_48 = bs->buffer;
          puVar4 = (uint8_t *)malloc((long)iVar7);
          bs->ptr = puVar4;
          memcpy(puVar4,local_48,(long)iVar1);
        }
        else {
          puVar4 = (uint8_t *)realloc(bs->ptr,(long)iVar7);
          bs->ptr = puVar4;
        }
        uVar10 = '\x03';
      }
    }
    else {
      uVar10 = '\x04';
      if (iVar7 <= iVar1) {
        do {
          iVar7 = iVar7 * 2;
        } while (iVar7 <= iVar1 + 1);
        bs->cap = iVar7;
        if (bs->ptr == bs->buffer) {
          local_48 = bs->buffer;
          puVar4 = (uint8_t *)malloc((long)iVar7);
          bs->ptr = puVar4;
          memcpy(puVar4,local_48,(long)iVar1);
        }
        else {
          puVar4 = (uint8_t *)realloc(bs->ptr,(long)iVar7);
          bs->ptr = puVar4;
        }
        uVar10 = '\x04';
      }
    }
    iVar1 = bs->size;
    bs->size = iVar1 + 1;
    bs->ptr[iVar1] = uVar10;
    write_string(bs,key,sz);
    pack_dict(L,bs,isarray);
    return;
  case 7:
    iVar1 = bs->size;
    iVar7 = bs->cap;
    if (iVar7 <= iVar1) {
      do {
        iVar7 = iVar7 * 2;
      } while (iVar7 <= iVar1 + 1);
      bs->cap = iVar7;
      if (bs->ptr == bs->buffer) {
        puVar4 = (uint8_t *)malloc((long)iVar7);
        bs->ptr = puVar4;
        memcpy(puVar4,bs->buffer,(long)iVar1);
      }
      else {
        puVar4 = (uint8_t *)realloc(bs->ptr,(long)iVar7);
        bs->ptr = puVar4;
      }
    }
    iVar1 = bs->size;
    bs->size = iVar1 + 1;
    bs->ptr[iVar1] = '\x03';
    write_string(bs,key,sz);
    __src = (int *)lua_touserdata(L,-1);
    iVar1 = *__src;
    iVar7 = bs->size;
    iVar6 = iVar7 + iVar1;
    iVar8 = bs->cap;
    if (iVar8 < iVar6) {
      do {
        iVar8 = iVar8 * 2;
      } while (iVar8 <= iVar6);
      bs->cap = iVar8;
      if (bs->ptr == bs->buffer) {
        puVar4 = (uint8_t *)malloc((long)iVar8);
        bs->ptr = puVar4;
        memcpy(puVar4,bs->buffer,(long)iVar7);
      }
      else {
        puVar4 = (uint8_t *)realloc(bs->ptr,(long)iVar8);
        bs->ptr = puVar4;
      }
    }
    memcpy(bs->ptr + bs->size,__src,(long)iVar1);
    bs->size = bs->size + iVar1;
  }
  return;
switchD_0011b2a2_caseD_b:
  uVar3 = local_50 - 3;
  if (uVar3 == 0) {
    uVar9 = 0;
  }
  else {
    pcVar5 = pcVar2 + (local_50 - 2);
    uVar11 = 0;
    do {
      uVar9 = uVar11;
      if (*pcVar5 == '\0') break;
      uVar11 = uVar11 + 1;
      pcVar5 = pcVar5 + -1;
      uVar9 = uVar3;
    } while (uVar3 != uVar11);
  }
  local_50 = uVar3;
  write_string(bs,pcVar2 + 2,uVar3 + ~uVar9);
  write_string(bs,pcVar2 + 2 + (local_50 - uVar9),uVar9);
  return;
}

Assistant:

static void
append_one(struct bson *bs, lua_State *L, const char *key, size_t sz) {
	int vt = lua_type(L,-1);
	switch(vt) {
	case LUA_TNUMBER:
		append_number(bs, L, key, sz);
		break;
	case LUA_TUSERDATA: {
		append_key(bs, BSON_DOCUMENT, key, sz);
		int32_t * doc = lua_touserdata(L,-1);
		int32_t sz = *doc;
		bson_reserve(bs,sz);
		memcpy(bs->ptr + bs->size, doc, sz);
		bs->size += sz;
		break;
	}
	case LUA_TSTRING: {
		size_t len;
		const char * str = lua_tolstring(L,-1,&len);
		if (len > 1 && str[0]==0) {
			int subt = (uint8_t)str[1];
			append_key(bs, subt, key, sz);
			switch(subt) {
			case BSON_BINARY:
				write_binary(bs, str+2, len-2);
				break;
			case BSON_OBJECTID:
				if (len != 2+12) {
					luaL_error(L, "Invalid object id %s", str+2);
				}
				// go though
			case BSON_JSCODE:
			case BSON_DBPOINTER:
			case BSON_SYMBOL:
			case BSON_CODEWS:
				bson_reserve(bs,len-2);
				memcpy(bs->ptr + bs->size, str+2, len-2);
				bs->size += len-2;
				break;
			case BSON_DATE: {
				if (len != 2+4) {
					luaL_error(L, "Invalid date");
				}
				const uint32_t * ts = (const uint32_t *)(str + 2);
				int64_t v = (int64_t)*ts * 1000;
				write_int64(bs, v);
				break;
			}
			case BSON_TIMESTAMP: {
				if (len != 2+8) {
					luaL_error(L, "Invalid timestamp");
				}
				const uint32_t * inc = (const uint32_t *)(str + 2);
				const uint32_t * ts = (const uint32_t *)(str + 6);
				write_int32(bs, *inc);
				write_int32(bs, *ts);
				break;
			}
			case BSON_REGEX: {
				str+=2;
				len-=3;
				size_t i;
				for (i=0;i<len;i++) {
					if (str[len-i-1]==0) {
						break;
					}
				}
				write_string(bs, str, len-i-1);
				write_string(bs, str + len-i, i);
				break;
			}
			case BSON_MINKEY:
			case BSON_MAXKEY:
			case BSON_NULL:
				break;
			default:
				luaL_error(L,"Invalid subtype %d", subt);
			}
		} else {
			size_t len;
			const char * str = lua_tolstring(L,-1,&len);
			append_key(bs, BSON_STRING, key, sz);
			int off = reserve_length(bs);
			write_string(bs, str, len);
			write_length(bs, len+1, off);		
		}
		break;
	}
	case LUA_TTABLE:
		append_table(bs, L, key, sz);
		break;
	case LUA_TBOOLEAN:
		append_key(bs, BSON_BOOLEAN, key, sz);
		write_byte(bs, lua_toboolean(L,-1));
		break;
	default:
		luaL_error(L, "Invalid value type : %s", lua_typename(L,vt));
	}
}